

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9BalanceLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_50;
  int fVeryVerbose;
  int fVerbose;
  int c;
  int fOptArea;
  int fRecursive;
  int fUseMuxes;
  int nCutNum;
  int nLutSize;
  int fUseOld;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  fUseMuxes = 6;
  fRecursive = 8;
  fOptArea = 1;
  c = 1;
  fVerbose = 1;
  local_50 = 0;
  Extra_UtilGetoptReset();
LAB_0029ccda:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"KCnmravwh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9BalanceLut(): There is no AIG.\n");
        return 1;
      }
      if (bVar1) {
        _nLutSize = Gia_ManBalanceLut(pAbc->pGia,fUseMuxes,fRecursive,local_50);
      }
      else {
        _nLutSize = Gia_ManLutBalance(pAbc->pGia,fUseMuxes,fOptArea,c,fVerbose,local_50);
      }
      Abc_FrameUpdateGia(pAbc,_nLutSize);
      return 0;
    }
    switch(iVar2) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by a char string.\n");
        goto LAB_0029ceca;
      }
      fRecursive = atoi(argv[globalUtilOptind]);
      iVar2 = fRecursive;
      break;
    default:
      goto LAB_0029ceca;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by a char string.\n");
        goto LAB_0029ceca;
      }
      fUseMuxes = atoi(argv[globalUtilOptind]);
      iVar2 = fUseMuxes;
      break;
    case 0x61:
      fVerbose = fVerbose ^ 1;
      goto LAB_0029ccda;
    case 0x68:
      goto LAB_0029ceca;
    case 0x6d:
      fOptArea = fOptArea ^ 1;
      goto LAB_0029ccda;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0029ccda;
    case 0x72:
      c = c ^ 1;
      goto LAB_0029ccda;
    case 0x76:
      local_50 = local_50 ^ 1;
      goto LAB_0029ccda;
    case 0x77:
      goto LAB_0029ccda;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0029ceca:
      Abc_Print(-2,"usage: &blut [-KC num] [-mravh]\n");
      Abc_Print(-2,"\t           performs AIG balancing for the given LUT size\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",6,
                (ulong)(uint)fUseMuxes);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",8,
                (ulong)(uint)fRecursive);
      pcVar3 = "no";
      if (fOptArea != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m       : toggle performing MUX restructuring [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r       : toggle performing recursive restructuring [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a       : toggle performing area-oriented restructuring [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (local_50 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9BalanceLut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose );
    extern Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int fUseOld      = 0;
    int nLutSize     = 6;
    int nCutNum      = 8;
    int fUseMuxes    = 1;
    int fRecursive   = 1;
    int fOptArea     = 1;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCnmravwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a char string.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a char string.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'n':
            fUseOld ^= 1;
            break;
        case 'm':
            fUseMuxes ^= 1;
            break;
        case 'r':
            fRecursive ^= 1;
            break;
        case 'a':
            fOptArea ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BalanceLut(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseOld )
        pTemp = Gia_ManBalanceLut( pAbc->pGia, nLutSize, nCutNum, fVerbose );
    else
        pTemp = Gia_ManLutBalance( pAbc->pGia, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &blut [-KC num] [-mravh]\n" );
    Abc_Print( -2, "\t           performs AIG balancing for the given LUT size\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", 6, nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", 8, nCutNum );
    Abc_Print( -2, "\t-m       : toggle performing MUX restructuring [default = %s]\n", fUseMuxes? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle performing recursive restructuring [default = %s]\n", fRecursive? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle performing area-oriented restructuring [default = %s]\n", fOptArea? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w       : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}